

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

uint32 __thiscall userinfo_t::ColorChanged(userinfo_t *this,uint32 colorval)

{
  UCVarValue value;
  FBaseCVar **ppFVar1;
  undefined4 uStack_2c;
  UCVarValue val;
  FBaseCVar *local_20;
  FColorCVar *color;
  userinfo_t *puStack_10;
  uint32 colorval_local;
  userinfo_t *this_local;
  
  color._4_4_ = colorval;
  puStack_10 = this;
  FName::FName((FName *)((long)&val + 4),NAME_Color);
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,(FName *)((long)&val + 4));
  local_20 = *ppFVar1;
  if (local_20 != (FBaseCVar *)0x0) {
    value._4_4_ = uStack_2c;
    value.Int = color._4_4_;
    FBaseCVar::SetGenericRep(local_20,value,CVAR_Int);
    return color._4_4_;
  }
  __assert_fail("color != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/d_netinfo.cpp"
                ,0x1f6,"uint32 userinfo_t::ColorChanged(uint32)");
}

Assistant:

uint32 userinfo_t::ColorChanged(uint32 colorval)
{
	FColorCVar *color = static_cast<FColorCVar *>((*this)[NAME_Color]);
	assert(color != NULL);
	UCVarValue val;
	val.Int = colorval;
	color->SetGenericRep(val, CVAR_Int);
	// This version is called by the menu code. Do not implicitly set colorset.
	return colorval;
}